

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O1

Var Js::Math::Hypot(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Var pvVar5;
  double *pdVar6;
  uint uVar7;
  double dVar8;
  int in_stack_00000010;
  Arguments local_70;
  undefined1 local_60 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  double local_38;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != (int)args.super_Arguments.Values) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x621,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d4514f;
    *puVar4 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_60 = (undefined1  [8])args.super_Arguments.Values;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_60,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)local_60 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x622,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d4514f;
    *puVar4 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x625,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d4514f;
    *puVar4 = 0;
  }
  uVar7 = local_60._0_4_ & 0xffffff;
  if (uVar7 == 3) {
    pvVar5 = Arguments::operator[]((Arguments *)local_60,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d4514f;
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      callInfo_local = (CallInfo)(double)(int)pvVar5;
    }
    else if ((ulong)pvVar5 >> 0x32 == 0) {
      callInfo_local = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
    }
    else {
      callInfo_local = (CallInfo)((ulong)pvVar5 ^ 0xfffc000000000000);
    }
    pvVar5 = Arguments::operator[]((Arguments *)local_60,2);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) {
LAB_00d4514f:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      local_38 = (double)(int)pvVar5;
    }
    else if ((ulong)pvVar5 >> 0x32 == 0) {
      local_38 = JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
    }
    else {
      local_38 = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
    }
    bVar3 = NumberUtilities::IsSpecial((double)callInfo_local,0x7ff0000000000000);
    if ((((!bVar3) &&
         (bVar3 = NumberUtilities::IsSpecial((double)callInfo_local,0xfff0000000000000), !bVar3)) &&
        (bVar3 = NumberUtilities::IsSpecial(local_38,0x7ff0000000000000), !bVar3)) &&
       (bVar3 = NumberUtilities::IsSpecial(local_38,0xfff0000000000000), !bVar3)) {
      bVar3 = NumberUtilities::IsNan((double)callInfo_local);
      if ((!bVar3) && (bVar3 = NumberUtilities::IsNan(local_38), !bVar3)) {
        dVar8 = hypot((double)callInfo_local,local_38);
        goto LAB_00d45102;
      }
      goto LAB_00d45135;
    }
LAB_00d450f7:
    pdVar6 = &NumberConstants::POSITIVE_INFINITY;
  }
  else {
    if (uVar7 != 2) {
      dVar8 = 0.0;
      if (3 < uVar7) {
        local_70.Info = (Type)local_60;
        local_70.Values = (Type)args.super_Arguments.Info;
        dVar8 = HypotHelper(&local_70,pSVar1);
      }
      goto LAB_00d45102;
    }
    pvVar5 = Arguments::operator[]((Arguments *)local_60,1);
    if (((ulong)pvVar5 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d4514f;
      *puVar4 = 0;
    }
    if (((ulong)pvVar5 & 0xffff000000000000) == 0x1000000000000) {
      dVar8 = (double)(int)pvVar5;
    }
    else if ((ulong)pvVar5 >> 0x32 == 0) {
      dVar8 = JavascriptConversion::ToNumber_Full(pvVar5,pSVar1);
    }
    else {
      dVar8 = (double)((ulong)pvVar5 ^ 0xfffc000000000000);
    }
    bVar3 = NumberUtilities::IsSpecial(dVar8,0x7ff0000000000000);
    if ((bVar3) || (bVar3 = NumberUtilities::IsSpecial(dVar8,0xfff0000000000000), bVar3))
    goto LAB_00d450f7;
    bVar3 = NumberUtilities::IsNan(dVar8);
    if (!bVar3) {
      dVar8 = ABS(dVar8);
      goto LAB_00d45102;
    }
LAB_00d45135:
    pdVar6 = &NumberConstants::NaN;
  }
  dVar8 = *pdVar6;
LAB_00d45102:
  pvVar5 = JavascriptNumber::ToVarNoCheck(dVar8,pSVar1);
  return pvVar5;
}

Assistant:

Var Math::Hypot(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Math_Constructor_hypot);

        // ES6 20.2.2.18 Math.hypot(value1, value2, ...values)
        // If no arguments are passed, the result is +0.
        // If any argument is +Infinity, the result is +Infinity.
        // If any argument is -Infinity, the result is +Infinity.
        // If no argument is +Infinity or -Infinity, and any argument is NaN, the result is NaN.
        // If all arguments are either +0 or -0, the result is +0.

        double result = JavascriptNumber::k_Zero; // If there are no arguments return value is positive zero.

        if (args.Info.Count == 2)
        {
            // Special case for one argument
            double x1 = JavascriptConversion::ToNumber(args[1], scriptContext);

            if (JavascriptNumber::IsPosInf(x1) || JavascriptNumber::IsNegInf(x1))
            {
                result = JavascriptNumber::POSITIVE_INFINITY;
            }
            else
            {
                result = Math::Abs(x1);
            }
        }
        else if (args.Info.Count == 3)
        {
            // CRT hypot call
            double x1 = JavascriptConversion::ToNumber(args[1], scriptContext);
            double x2 = JavascriptConversion::ToNumber(args[2], scriptContext);

            if (JavascriptNumber::IsPosInf(x1) || JavascriptNumber::IsNegInf(x1) ||
                JavascriptNumber::IsPosInf(x2) || JavascriptNumber::IsNegInf(x2))
            {
                result = JavascriptNumber::POSITIVE_INFINITY;
            }
            else if (JavascriptNumber::IsNan(x1) || JavascriptNumber::IsNan(x2))
            {
                result = JavascriptNumber::NaN;
            }
            else
            {
                result = ::hypot(x1, x2);
            }
        }
        else if (args.Info.Count > 3)
        {
            // Uncommon case of more than 2 arguments for hypot
            result = Math::HypotHelper(args, scriptContext);
        }

        return JavascriptNumber::ToVarNoCheck(result, scriptContext);
    }